

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkPipelineSampleLocationsStateCreateInfoEXT *create_info,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value,
               DynamicStateInfo *dynamic_state_info)

{
  byte local_141;
  GenericStringRef<char> local_140;
  GenericStringRef<char> local_130;
  GenericStringRef<char> local_120;
  GenericStringRef<char> local_110;
  undefined1 local_100 [8];
  Value loc;
  undefined1 local_e8 [4];
  uint32_t i;
  Value locs;
  GenericStringRef<char> local_c8;
  GenericStringRef<char> local_b8;
  undefined1 local_a8 [8];
  Value extent;
  GenericStringRef<char> local_88;
  VkSampleLocationsInfoEXT *local_78;
  VkSampleLocationsInfoEXT *info;
  Value locations;
  undefined1 local_58 [7];
  bool dynamic_enable;
  GenericStringRef<char> local_48;
  undefined1 local_38 [8];
  Value value;
  DynamicStateInfo *dynamic_state_info_local;
  Value *out_value_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  VkPipelineSampleLocationsStateCreateInfoEXT *create_info_local;
  
  value.data_.o.members = (Member *)dynamic_state_info;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_38,kObjectType);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_48,(char (*) [6])0x61bcb2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkStructureType>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,&local_48,create_info->sType,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<22u>
            ((GenericStringRef<char> *)local_58,(char (*) [22])"sampleLocationsEnable");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,(StringRefType *)local_58,create_info->sampleLocationsEnable,alloc);
  local_141 = 0;
  if (value.data_.s.str != (Ch *)0x0) {
    local_141 = value.data_.s.str[0x2f];
  }
  locations.data_.f.flags._1_1_ = local_141 & 1;
  if ((((locations.data_.f.flags._1_1_ != 0) || (create_info->sampleLocationsEnable != 0)) &&
      (value.data_.s.str != (Ch *)0x0)) &&
     ((undefined1  [16])
      ((undefined1  [16])((value.data_.o.members)->value).data_ & (undefined1  [16])0x1000000000000)
      == (undefined1  [16])0x0)) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&info,kObjectType);
    local_78 = &create_info->sampleLocationsInfo;
    rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_88,(char (*) [6])0x61bcb2);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<VkStructureType>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&info,&local_88,local_78->sType,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<24u>
              ((GenericStringRef<char> *)((long)&extent.data_ + 8),
               (char (*) [24])"sampleLocationsPerPixel");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<VkSampleCountFlagBits>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&info,(StringRefType *)((long)&extent.data_ + 8),local_78->sampleLocationsPerPixel
               ,alloc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_a8,kObjectType);
    rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_b8,(char (*) [6])0x62edb6);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_a8,&local_b8,(local_78->sampleLocationGridSize).width,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_c8,(char (*) [7])"height");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_a8,&local_c8,(local_78->sampleLocationGridSize).height,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<23u>
              ((GenericStringRef<char> *)((long)&locs.data_ + 8),
               (char (*) [23])"sampleLocationGridSize");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&info,(StringRefType *)((long)&locs.data_ + 8),
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_a8,alloc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_a8);
    if (local_78->sampleLocationsCount != 0) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_e8,kArrayType);
      for (loc.data_._12_4_ = 0; (uint)loc.data_._12_4_ < local_78->sampleLocationsCount;
          loc.data_._12_4_ = loc.data_._12_4_ + 1) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)local_100,kObjectType);
        rapidjson::GenericStringRef<char>::GenericStringRef<2u>(&local_110,(char (*) [2])0x5d9c59);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)local_100,&local_110,
                           local_78->pSampleLocations[(uint)loc.data_._12_4_].x,alloc);
        rapidjson::GenericStringRef<char>::GenericStringRef<2u>(&local_120,(char (*) [2])0x5d3411);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)local_100,&local_120,
                           local_78->pSampleLocations[(uint)loc.data_._12_4_].y,alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_e8,
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_100,alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)local_100);
      }
      rapidjson::GenericStringRef<char>::GenericStringRef<16u>
                (&local_130,(char (*) [16])"sampleLocations");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&info,&local_130,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_e8,alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_e8);
    }
    rapidjson::GenericStringRef<char>::GenericStringRef<20u>
              (&local_140,(char (*) [20])"sampleLocationsInfo");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_38,&local_140,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&info,alloc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&info);
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  operator=(out_value,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_38);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_38);
  return true;
}

Assistant:

static bool json_value(const VkPipelineSampleLocationsStateCreateInfoEXT &create_info, Allocator &alloc, Value *out_value,
                       const DynamicStateInfo *dynamic_state_info)
{
	Value value(kObjectType);
	value.AddMember("sType", create_info.sType, alloc);
	value.AddMember("sampleLocationsEnable", create_info.sampleLocationsEnable, alloc);

	bool dynamic_enable = dynamic_state_info && dynamic_state_info->sample_locations_enable;
	if ((dynamic_enable || create_info.sampleLocationsEnable) &&
	    dynamic_state_info && !dynamic_state_info->sample_locations)
	{
		Value locations(kObjectType);
		auto &info = create_info.sampleLocationsInfo;

		locations.AddMember("sType", info.sType, alloc);
		locations.AddMember("sampleLocationsPerPixel", info.sampleLocationsPerPixel, alloc);

		{
			Value extent(kObjectType);
			extent.AddMember("width", info.sampleLocationGridSize.width, alloc);
			extent.AddMember("height", info.sampleLocationGridSize.height, alloc);
			locations.AddMember("sampleLocationGridSize", extent, alloc);
		}

		if (info.sampleLocationsCount)
		{
			Value locs(kArrayType);
			for (uint32_t i = 0; i < info.sampleLocationsCount; i++)
			{
				Value loc(kObjectType);
				loc.AddMember("x", info.pSampleLocations[i].x, alloc);
				loc.AddMember("y", info.pSampleLocations[i].y, alloc);
				locs.PushBack(loc, alloc);
			}
			locations.AddMember("sampleLocations", locs, alloc);
		}

		value.AddMember("sampleLocationsInfo", locations, alloc);
	}

	*out_value = value;
	return true;
}